

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::EliminateZeroCoefficientRecurrents
          (SENodeSimplifyImpl *this,SENode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar3;
  undefined4 extraout_var_01;
  pointer pSVar4;
  ScalarEvolutionAnalysis *pSVar5;
  reference ppSVar6;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_a8;
  SENode *local_a0;
  SENode *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *__range2_1;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> new_add;
  SENode *local_70;
  SENode *local_68;
  SENode *coefficient;
  SENode *child;
  iterator __end2;
  iterator __begin2;
  SENode *__range2;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> new_children;
  bool has_change;
  SENode *node_local;
  SENodeSimplifyImpl *this_local;
  
  iVar2 = (**node->_vptr_SENode)();
  this_local = (SENodeSimplifyImpl *)node;
  if (iVar2 == 2) {
    new_children.
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    memset(&__range2,0,0x18);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::vector
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               &__range2);
    __end2 = SENode::begin(node);
    child = (SENode *)SENode::end(node);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                       *)&child), bVar1) {
      ppSVar6 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                ::operator*(&__end2);
      coefficient = *ppSVar6;
      iVar2 = (**coefficient->_vptr_SENode)();
      if (iVar2 == 1) {
        iVar2 = (*coefficient->_vptr_SENode[6])();
        local_68 = SERecurrentNode::GetCoefficient((SERecurrentNode *)CONCAT44(extraout_var,iVar2));
        iVar2 = (**local_68->_vptr_SENode)();
        if (iVar2 == 0) {
          iVar2 = (*local_68->_vptr_SENode[4])();
          iVar3 = SEConstantNode::FoldToSingleValue
                            ((SEConstantNode *)CONCAT44(extraout_var_00,iVar2));
          if (iVar3 == 0) {
            iVar2 = (*coefficient->_vptr_SENode[6])();
            local_70 = SERecurrentNode::GetOffset
                                 ((SERecurrentNode *)CONCAT44(extraout_var_01,iVar2));
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::
            push_back((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                      &__range2,&local_70);
            new_children.
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            goto LAB_00a9805d;
          }
        }
        std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::push_back
                  ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                   &__range2,&coefficient);
      }
      else {
        std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::push_back
                  ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                   &__range2,&coefficient);
      }
LAB_00a9805d:
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
      ::operator++(&__end2);
    }
    if ((new_children.
         super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      new_add._M_t.
      super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>._M_t
      .super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl._4_4_ = 1;
    }
    else {
      pSVar4 = (pointer)::operator_new(0x30);
      pSVar5 = SENode::GetParentAnalysis(this->node_);
      SEAddNode::SEAddNode((SEAddNode *)pSVar4,pSVar5);
      std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
      unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
                ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                 &__range2_1,pSVar4);
      __end2_1 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::
                 begin((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                       &__range2);
      child_1 = (SENode *)
                std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                          ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                            *)&__range2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                 *)&child_1), bVar1) {
        ppSVar6 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                  ::operator*(&__end2_1);
        local_a0 = *ppSVar6;
        pSVar4 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2_1);
        (*pSVar4->_vptr_SENode[3])(pSVar4,local_a0);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
        ::operator++(&__end2_1);
      }
      pSVar5 = this->analysis_;
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      unique_ptr(&local_a8,
                 (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
                 &__range2_1);
      this_local = (SENodeSimplifyImpl *)ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar5,&local_a8);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr(&local_a8);
      new_add._M_t.
      super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>._M_t
      .super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
                  &__range2_1);
    }
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::~vector
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               &__range2);
  }
  return (SENode *)this_local;
}

Assistant:

SENode* SENodeSimplifyImpl::EliminateZeroCoefficientRecurrents(SENode* node) {
  if (node->GetType() != SENode::Add) return node;

  bool has_change = false;

  std::vector<SENode*> new_children{};
  for (SENode* child : *node) {
    if (child->GetType() == SENode::RecurrentAddExpr) {
      SENode* coefficient = child->AsSERecurrentNode()->GetCoefficient();
      // If coefficient is zero then we can eliminate the recurrent expression
      // entirely and just return the offset as the recurrent expression is
      // representing the equation coefficient*iterations + offset.
      if (coefficient->GetType() == SENode::Constant &&
          coefficient->AsSEConstantNode()->FoldToSingleValue() == 0) {
        new_children.push_back(child->AsSERecurrentNode()->GetOffset());
        has_change = true;
      } else {
        new_children.push_back(child);
      }
    } else {
      new_children.push_back(child);
    }
  }

  if (!has_change) return node;

  std::unique_ptr<SENode> new_add{new SEAddNode(node_->GetParentAnalysis())};

  for (SENode* child : new_children) {
    new_add->AddChild(child);
  }

  return analysis_.GetCachedOrAdd(std::move(new_add));
}